

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t sVar3;
  Type *value;
  uint index;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = SourceCodeInfo_Location::unknown_fields(this);
    sVar5 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  sVar2 = internal::WireFormatLite::Int32Size(&this->path_);
  if (sVar2 != 0) {
    iVar7 = (int)sVar2;
    sVar3 = io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    sVar5 = sVar5 + sVar3 + 1;
  }
  this->_path_cached_byte_size_ = iVar7;
  lVar6 = sVar5 + sVar2;
  sVar5 = internal::WireFormatLite::Int32Size(&this->span_);
  if (sVar5 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = (int)sVar5;
    sVar2 = io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    lVar6 = lVar6 + sVar2 + 1;
  }
  this->_span_cached_byte_size_ = iVar7;
  uVar1 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = lVar6 + sVar5 + (ulong)uVar1;
  uVar4 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
    index = 0;
  }
  for (; uVar4 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,index);
    sVar2 = internal::WireFormatLite::StringSize(value);
    sVar5 = sVar5 + sVar2;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->leading_comments_).ptr_);
      sVar5 = sVar5 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->trailing_comments_).ptr_);
      sVar5 = sVar5 + sVar2 + 1;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->leading_detached_comments_size());
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->leading_detached_comments(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}